

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O2

void GetNextMatch(void)

{
  UINT8 UVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  UINT8 *pUVar5;
  NODE_conflict *pNVar6;
  NODE_conflict *pNVar7;
  NODE_conflict *pNVar8;
  NODE_conflict *pNVar9;
  INT32 IVar10;
  uint uVar11;
  NODE_conflict NVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  
  pUVar5 = mText;
  mRemainder = mRemainder + -1;
  mPos = mPos + 1;
  if (mPos == 0x100000) {
    memmove(mText,mText + 0x80000,0x80100);
    IVar10 = FreadCrc(pUVar5 + 0x80100,0x80000);
    mRemainder = mRemainder + IVar10;
    mPos = 0x80000;
  }
  NVar12 = mPos;
  pNVar9 = mNext;
  pNVar8 = mPrev;
  pNVar7 = mParent;
  lVar13 = (long)mPos;
  if (mParent[lVar13] != 0) {
    iVar2 = mPrev[lVar13];
    iVar3 = mNext[lVar13];
    mNext[iVar2] = iVar3;
    pNVar8[iVar3] = iVar2;
    iVar2 = pNVar7[lVar13];
    lVar16 = (long)iVar2;
    pNVar7[lVar13] = 0;
    if ((lVar16 < 0x80000) &&
       (UVar1 = mChildCount[lVar16], mChildCount[lVar16] = UVar1 - 1, pNVar6 = mPosition,
       (byte)(UVar1 - 1) < 2)) {
      uVar14 = mPosition[lVar16] & 0x7fffffff;
      lVar13 = lVar16;
      uVar15 = uVar14 - 0x80000;
      uVar11 = uVar14 - 0x80000;
      if ((int)uVar14 < NVar12) {
        uVar15 = uVar14;
        uVar11 = uVar14;
      }
      while( true ) {
        lVar17 = (long)pNVar7[lVar13];
        uVar14 = pNVar6[lVar17];
        if (-1 < (int)uVar14) break;
        uVar14 = uVar14 & 0x7fffffff;
        uVar18 = uVar14 - 0x80000;
        if ((int)uVar14 < NVar12) {
          uVar18 = uVar14;
        }
        if ((int)uVar15 < (int)uVar18) {
          uVar15 = uVar18;
        }
        pNVar6[lVar17] = uVar15 | 0x80000;
        lVar13 = lVar17;
      }
      if (pNVar7[lVar13] < 0x80000) {
        uVar18 = uVar14 - 0x80000;
        if ((int)uVar14 < NVar12) {
          uVar18 = uVar14;
        }
        if ((int)uVar18 <= (int)uVar15) {
          uVar18 = uVar15;
        }
        pNVar6[lVar17] = uVar18 | 0x80080000;
      }
      NVar12 = Child(iVar2,mText[(long)(int)uVar11 + (ulong)mLevel[lVar16]]);
      iVar3 = pNVar8[NVar12];
      iVar4 = pNVar9[NVar12];
      pNVar9[iVar3] = iVar4;
      pNVar8[iVar4] = iVar3;
      iVar3 = pNVar8[lVar16];
      pNVar9[iVar3] = NVar12;
      pNVar8[NVar12] = iVar3;
      iVar3 = pNVar9[lVar16];
      pNVar8[iVar3] = NVar12;
      pNVar9[NVar12] = iVar3;
      pNVar7[NVar12] = pNVar7[lVar16];
      pNVar7[lVar16] = 0;
      pNVar9[lVar16] = mAvail;
      mAvail = iVar2;
    }
  }
  InsertNode();
  return;
}

Assistant:

STATIC
  VOID
  GetNextMatch (
  VOID
  )
  /*++

  Routine Description:

  Advance the current position (read new data if needed).
  Delete outdated string info. Find a match string for current position.

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  INT32 Number;

  mRemainder--;
  mPos++;
  if (mPos == WNDSIZ * 2) {
    memmove (&mText[0], &mText[WNDSIZ], WNDSIZ + MAXMATCH);
    Number = FreadCrc (&mText[WNDSIZ + MAXMATCH], WNDSIZ);
    mRemainder += Number;
    mPos = WNDSIZ;
  }

  DeleteNode ();
  InsertNode ();
}